

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O1

void __thiscall
chrono::ChLinkMateOrthogonal::ChLinkMateOrthogonal
          (ChLinkMateOrthogonal *this,ChLinkMateOrthogonal *other)

{
  ChLinkMateGeneric::ChLinkMateGeneric
            (&this->super_ChLinkMateGeneric,&other->super_ChLinkMateGeneric);
  (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.super_ChLinkBase.super_ChPhysicsItem
  .super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkMateGeneric_00b44158;
  (this->reldir1).m_data[0] = 0.0;
  (this->reldir1).m_data[1] = 0.0;
  (this->reldir1).m_data[2] = 0.0;
  (this->reldir2).m_data[0] = 0.0;
  (this->reldir1).m_data[2] = 0.0;
  (this->reldir2).m_data[0] = 0.0;
  (this->reldir2).m_data[1] = 0.0;
  (this->reldir2).m_data[2] = 0.0;
  if (other != this) {
    (this->reldir1).m_data[0] = (other->reldir1).m_data[0];
    (this->reldir1).m_data[1] = (other->reldir1).m_data[1];
    (this->reldir1).m_data[2] = (other->reldir1).m_data[2];
    (this->reldir2).m_data[0] = (other->reldir2).m_data[0];
    (this->reldir2).m_data[1] = (other->reldir2).m_data[1];
    (this->reldir2).m_data[2] = (other->reldir2).m_data[2];
  }
  return;
}

Assistant:

ChLinkMateOrthogonal::ChLinkMateOrthogonal(const ChLinkMateOrthogonal& other) : ChLinkMateGeneric(other) {
    reldir1 = other.reldir1;
    reldir2 = other.reldir2;
}